

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_body(void)

{
  player_body *ppVar1;
  player_body *p;
  long lVar2;
  ulong uVar3;
  
  p = bodies;
  while (p != (player_body *)0x0) {
    ppVar1 = p->next;
    string_free(p->name);
    lVar2 = 0x10;
    for (uVar3 = 0; uVar3 < p->count; uVar3 = uVar3 + 1) {
      string_free(*(char **)((long)&p->slots->next + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    mem_free(p->slots);
    mem_free(p);
    p = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_body(void)
{
	struct player_body *b = bodies;
	struct player_body *next;
	int i;

	while (b) {
		next = b->next;
		string_free((char *)b->name);
		for (i = 0; i < b->count; i++)
			string_free((char *)b->slots[i].name);
		mem_free(b->slots);
		mem_free(b);
		b = next;
	}
}